

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::optimizeDoubletonWithConstantOnRight
          (OptimizeInstructions *this,Binary *curr)

{
  int iVar1;
  Expression *pEVar2;
  Type TVar3;
  Type type;
  ulong uVar4;
  uintptr_t uVar5;
  size_type sVar6;
  undefined1 auVar7 [40];
  bool bVar8;
  Index IVar9;
  uint uVar10;
  BinaryOp BVar11;
  uint uVar12;
  BinaryOp BVar13;
  Module *pMVar14;
  ulong extraout_RDX;
  optional<wasm::Type> type_00;
  undefined4 uStack_30c;
  undefined8 local_2f8;
  anon_union_16_6_1532cd5a_for_Literal_0 local_2f0;
  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
  local_2e0 [5];
  char local_210;
  Module *local_190;
  Binary *inner_4;
  Const *c2_4;
  anon_union_16_6_1532cd5a_for_Literal_0 local_178;
  pointer local_168;
  pointer local_158;
  undefined1 local_138 [40];
  _Head_base<0UL,_wasm::Global_*,_false> local_110;
  Binary *inner;
  pointer local_100;
  pointer local_f8;
  undefined1 local_e8 [8];
  Builder builder;
  undefined1 local_d8 [48];
  pointer local_a8;
  Const *c1_5;
  Index local_94;
  undefined1 local_90 [8];
  Const *c2;
  undefined1 local_80 [8];
  Const *c1;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  *local_70;
  _Alloc_hider local_68;
  pointer local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_40 [8];
  Const *c1_1;
  
  pEVar2 = curr->right;
  if (pEVar2->_id == ConstId) {
    pMVar14 = (Module *)curr->left;
    local_2e0[0].binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_2e0[0].submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
    local_2f0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_80;
    if ((*(Id *)&(pMVar14->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == BinaryId) &&
       (local_80 = (undefined1  [8])
                   (pMVar14->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish, *(char *)local_80 == '\x0e')) {
      c1_5 = (Const *)this;
      Literal::Literal((Literal *)&local_178.func,(Literal *)((long)local_80 + 0x10));
      bVar8 = Match::Internal::
              Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
              ::matches(local_2e0,
                        (candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_>
                         *)&local_178.func);
      Literal::~Literal((Literal *)&local_178.func);
      if ((bVar8) &&
         (*(BinaryOp *)
           &(pMVar14->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage == curr->op)) {
        TVar3.id = ((Type *)&(pMVar14->exports).
                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->id;
        if (6 < TVar3.id) goto LAB_009da6d0;
        BVar13 = *(BinaryOp *)
                  &(pMVar14->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (BVar13 == *(BinaryOp *)(&DAT_00df9120 + TVar3.id * 4)) {
          Literal::and_((Literal *)&local_2f0.func,(Literal *)((long)local_80 + 0x10),
                        (Literal *)(pEVar2 + 1));
          Literal::operator=((Literal *)&((Named *)local_80)->hasExplicitName,
                             (Literal *)&local_2f0.func);
LAB_009d9c83:
          Literal::~Literal((Literal *)&local_2f0.func);
          return (Expression *)pMVar14;
        }
        if (BVar13 == *(BinaryOp *)(&DAT_00df92bc + TVar3.id * 4)) {
          Literal::or_((Literal *)&local_2f0.func,(Literal *)((long)local_80 + 0x10),
                       (Literal *)(pEVar2 + 1));
          Literal::operator=((Literal *)&((Named *)local_80)->hasExplicitName,
                             (Literal *)&local_2f0.func);
          goto LAB_009d9c83;
        }
        if (BVar13 == *(BinaryOp *)(&DAT_00df90cc + TVar3.id * 4)) {
          Literal::xor_((Literal *)&local_2f0.func,(Literal *)((long)local_80 + 0x10),
                        (Literal *)(pEVar2 + 1));
          Literal::operator=((Literal *)&((Named *)local_80)->hasExplicitName,
                             (Literal *)&local_2f0.func);
          goto LAB_009d9c83;
        }
        if (BVar13 == *(BinaryOp *)(&DAT_00df90e8 + TVar3.id * 4)) {
          Literal::mul((Literal *)&local_2f0.func,(Literal *)((long)local_80 + 0x10),
                       (Literal *)(pEVar2 + 1));
          Literal::operator=((Literal *)&((Named *)local_80)->hasExplicitName,
                             (Literal *)&local_2f0.func);
          goto LAB_009d9c83;
        }
        if ((BVar13 < EqInt64) && ((0xf800007c00U >> ((ulong)BVar13 & 0x3f) & 1) != 0)) {
          c2_4 = (Const *)(ulong)BVar13;
          local_94 = Bits::getEffectiveShifts((Expression *)local_80);
          IVar9 = Bits::getEffectiveShifts(pEVar2);
          type.id = ((Type *)((long)local_80 + 8))->id;
          uVar12 = 0x1f;
          if (type.id != 2) {
            if (type.id != 3) {
              handle_unreachable("unexpected type",
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                                 ,0x40);
            }
            uVar12 = 0x3f;
          }
          uVar10 = IVar9 + local_94;
          if (uVar10 == (uVar12 & uVar10)) {
            Literal::makeFromInt32((Literal *)&local_2f0.func,uVar10,type);
            Literal::operator=((Literal *)&((Named *)local_80)->hasExplicitName,
                               (Literal *)&local_2f0.func);
            goto LAB_009d9c83;
          }
          if ((BVar13 < EqInt64) && ((0xc000006000U >> ((ulong)c2_4 & 0x3f) & 1) != 0)) {
            Literal::makeFromInt32((Literal *)&local_2f0.func,uVar12 & uVar10,type);
            Literal::operator=((Literal *)&((Named *)local_80)->hasExplicitName,
                               (Literal *)&local_2f0.func);
            goto LAB_009d9c83;
          }
          BVar11 = Abstract::getBinary(TVar3,Shl);
          if ((BVar13 == BVar11) || (BVar11 = Abstract::getBinary(TVar3,ShrU), BVar13 == BVar11)) {
            pEVar2 = (Expression *)
                     (pMVar14->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            Literal::makeZero((Literal *)&local_2f0.func,(Type)((Type *)((long)local_80 + 8))->id);
            Literal::operator=((Literal *)((long)local_80 + 0x10),(Literal *)&local_2f0.func);
            Literal::~Literal((Literal *)&local_2f0.func);
            EffectAnalyzer::EffectAnalyzer
                      ((EffectAnalyzer *)&local_2f0.func,
                       (PassOptions *)
                       ((c1_5->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.
                        type.id + 0x30),
                       (Module *)
                       c1_5[7].value.field_0.gcData.
                       super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr,pEVar2);
            if (local_210 == '\x01') {
              EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&local_2f0.func);
            }
            else {
              bVar8 = EffectAnalyzer::hasNonTrapSideEffects((EffectAnalyzer *)&local_2f0.func);
              EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&local_2f0.func);
              if (!bVar8) {
                return (Expression *)local_80;
              }
            }
            local_e8 = (undefined1  [8])c1_5[7].value.field_0.i64;
            local_178.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)Builder::makeDrop((Builder *)local_e8,pEVar2);
            local_178.func.super_IString.str._M_str = (char *)local_80;
            local_2f0.func.super_IString.str._M_str = (char *)0x2;
            type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._8_8_ = 0;
            type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload =
                 (_Storage<wasm::Type,_true>)extraout_RDX;
            local_2f0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)&local_178;
            pMVar14 = (Module *)
                      Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                                ((Builder *)local_e8,
                                 (initializer_list<wasm::Expression_*> *)&local_2f0.func,type_00);
            return (Expression *)pMVar14;
          }
          BVar11 = Abstract::getBinary(TVar3,ShrS);
          if (BVar13 == BVar11) {
            uVar12 = wasm::Type::getByteSize((Type *)((long)local_80 + 8));
            Literal::makeFromInt32
                      ((Literal *)&local_2f0.func,uVar12 * 8 + -1,
                       (Type)((Type *)((long)local_80 + 8))->id);
            Literal::operator=((Literal *)&((Named *)local_80)->hasExplicitName,
                               (Literal *)&local_2f0.func);
            goto LAB_009d9c83;
          }
        }
      }
    }
    local_d8._0_8_ = local_138;
    local_138._0_8_ = (__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)0x0;
    local_2e0[0].binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_2e0[0].submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
    local_2f0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_40;
    local_70 = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                *)local_e8;
    builder.wasm._0_4_ = 10;
    local_168 = (pointer)0x0;
    local_158 = (pointer)0x0;
    local_178.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_90;
    local_80 = (undefined1  [8])0x0;
    c1._0_4_ = 5;
    if ((((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
          BinaryId) &&
        (BVar13 = curr->op, local_e8 = (undefined1  [8])&local_110, local_d8._8_8_ = &local_2f0,
        local_68._M_p = (pointer)&local_178,
        BVar11 = Abstract::getBinary((Type)(curr->left->type).id,Mul), BVar13 == BVar11)) &&
       (bVar8 = Match::Internal::
                Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                              *)&stack0xffffffffffffff90), bVar8)) {
      uVar4 = ((Type *)&(((_Vector_impl *)
                         &((local_110._M_head_impl)->super_Importable).super_Named.name)->
                        super__Vector_impl_data)._M_finish)->id;
      if (uVar4 < 7) {
        *(undefined4 *)&((local_110._M_head_impl)->super_Importable).super_Named.hasExplicitName =
             *(undefined4 *)(&DAT_00df90e8 + uVar4 * 4);
        Literal::shl((Literal *)&local_2f0.func,(Literal *)((long)local_90 + 0x10),
                     (Literal *)&((string *)local_40)->field_2);
        Literal::operator=((Literal *)&((string *)local_40)->field_2,(Literal *)&local_2f0.func);
LAB_009d9fe0:
        Literal::~Literal((Literal *)&local_2f0.func);
        return (Expression *)(Module *)local_110._M_head_impl;
      }
LAB_009da6d0:
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x1c4,"BasicType wasm::Type::getBasic() const");
    }
    local_138._0_8_ = (__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)0x0;
    local_2e0[0].binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_2e0[0].submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
    local_2f0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_40;
    builder.wasm._0_4_ = 5;
    local_d8._0_8_ = local_138;
    local_168 = (pointer)0x0;
    local_158 = (pointer)0x0;
    local_178.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_90;
    local_80 = (undefined1  [8])0x0;
    c1._0_4_ = 10;
    local_70 = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                *)local_e8;
    local_68._M_p = (pointer)&local_178;
    if ((((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
          BinaryId) &&
        (BVar13 = curr->op, local_e8 = (undefined1  [8])&local_110, local_d8._8_8_ = &local_2f0,
        BVar11 = Abstract::getBinary((Type)(curr->left->type).id,Shl), BVar13 == BVar11)) &&
       (bVar8 = Match::Internal::
                Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                              *)&stack0xffffffffffffff90), bVar8)) {
      Literal::shl((Literal *)&local_2f0.func,(Literal *)&((string *)local_40)->field_2,
                   (Literal *)((long)local_90 + 0x10));
      Literal::operator=((Literal *)&((string *)local_40)->field_2,(Literal *)&local_2f0.func);
      goto LAB_009d9fe0;
    }
    local_138._0_8_ = (__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)0x0;
    local_2e0[0].binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_2e0[0].submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
    local_2f0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_40;
    local_70 = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                *)0x0;
    local_60 = (pointer)local_138;
    local_168 = (pointer)0x0;
    local_158 = (pointer)0x0;
    local_178.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_90;
    local_e8 = (undefined1  [8])0x0;
    builder.wasm._0_4_ = 10;
    local_d8._0_8_ = local_80;
    local_58._M_allocated_capacity = (size_type)&local_2f0;
    if ((((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
          BinaryId) &&
        (BVar13 = curr->op, local_d8._8_8_ = &local_178, local_80 = (undefined1  [8])&local_110,
        BVar11 = Abstract::getBinary((Type)(curr->left->type).id,Shl), BVar13 == BVar11)) &&
       (bVar8 = Match::Internal::
                Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                              *)local_d8), bVar8)) {
      uVar4 = ((Type *)&(((_Vector_impl *)
                         &((local_110._M_head_impl)->super_Importable).super_Named.name)->
                        super__Vector_impl_data)._M_finish)->id;
      if (6 < uVar4) goto LAB_009da6d0;
      iVar1 = *(int *)&((local_110._M_head_impl)->super_Importable).super_Named.hasExplicitName;
      if ((iVar1 == *(int *)(&DAT_00df92a0 + uVar4 * 4)) ||
         (iVar1 == *(int *)(&DAT_00df9104 + uVar4 * 4))) {
        if (*(Id *)&(((string *)local_40)->_M_dataplus)._M_p != ConstId) goto LAB_009da65b;
        uVar5 = ((Type *)&((string *)local_40)->_M_string_length)->id;
        if (uVar5 == 3) {
          if ((((vector<char,_std::allocator<char>_> *)((long)local_40 + 0x20))->
              super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x3) goto LAB_009da6b1;
          uVar12 = *(uint *)&((string *)local_40)->field_2 & 0x3f;
        }
        else {
          if (uVar5 != 2) goto LAB_009da67a;
          if ((((vector<char,_std::allocator<char>_> *)((long)local_40 + 0x20))->
              super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x2) goto LAB_009da692;
          uVar12 = *(uint *)&((string *)local_40)->field_2 & 0x1f;
        }
        if (*(char *)local_90 != '\x0e') goto LAB_009da65b;
        if ((__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)
            *(tuple<wasm::Memory_*,_std::default_delete<wasm::Memory>_> *)((long)local_90 + 8) ==
            (__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)0x3) {
          if ((((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> *)
               &(((pointer)((long)local_90 + 0x20))->_M_dataplus)._M_p)->_M_t).
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl != (Function *)0x3)
          goto LAB_009da6b1;
          uVar10 = *(uint *)((long)local_90 + 0x10) & 0x3f;
        }
        else {
          if ((_Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>)
              *(tuple<wasm::Memory_*,_std::default_delete<wasm::Memory>_> *)((long)local_90 + 8) !=
              (_Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>)0x2)
          goto LAB_009da67a;
          if ((((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> *)
               &(((pointer)((long)local_90 + 0x20))->_M_dataplus)._M_p)->_M_t).
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl != (Function *)0x2)
          goto LAB_009da692;
          uVar10 = *(uint *)((long)local_90 + 0x10) & 0x1f;
        }
        if (uVar12 == uVar10) {
          uVar4 = ((Type *)&((string *)local_40)->_M_string_length)->id;
          if (uVar4 == 2) {
            IVar9 = Bits::getEffectiveShifts((Expression *)local_40);
            Literal::makeFromInt32((Literal *)&local_2f0.func,-1 << ((byte)IVar9 & 0x1f),(Type)0x2);
            Literal::operator=((Literal *)&((string *)local_40)->field_2,(Literal *)&local_2f0.func)
            ;
            Literal::~Literal((Literal *)&local_2f0.func);
            BVar13 = AndInt32;
          }
          else {
            IVar9 = Bits::getEffectiveShifts((Expression *)local_40);
            Literal::makeFromInt64((Literal *)&local_2f0.func,-1L << ((byte)IVar9 & 0x3f),(Type)0x3)
            ;
            Literal::operator=((Literal *)&((string *)local_40)->field_2,(Literal *)&local_2f0.func)
            ;
            Literal::~Literal((Literal *)&local_2f0.func);
            if (6 < uVar4) goto LAB_009da6d0;
            BVar13 = *(BinaryOp *)(&DAT_00df9120 + uVar4 * 4);
          }
          goto LAB_009da642;
        }
      }
    }
    local_138._0_8_ = (__uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>)0x0;
    local_2e0[0].binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_2e0[0].submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
    local_2f0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_40;
    builder.wasm._0_4_ = 10;
    local_d8._0_8_ = local_138;
    local_168 = (pointer)0x0;
    local_158 = (pointer)0x0;
    local_178.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_90;
    local_80 = (undefined1  [8])0x0;
    c1._0_4_ = 0xb;
    local_70 = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                *)local_e8;
    local_e8 = (undefined1  [8])&local_110;
    local_d8._8_8_ = &local_2f0;
    if ((((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
          BinaryId) &&
        (BVar13 = curr->op, local_68._M_p = (pointer)&local_178,
        BVar11 = Abstract::getBinary((Type)(curr->left->type).id,ShrU), BVar13 == BVar11)) &&
       (bVar8 = Match::Internal::
                Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                              *)&stack0xffffffffffffff90), bVar8)) {
      if (*(Id *)&(((string *)local_40)->_M_dataplus)._M_p != ConstId) goto LAB_009da65b;
      uVar5 = ((Type *)&((string *)local_40)->_M_string_length)->id;
      if (uVar5 == 3) {
        if ((((vector<char,_std::allocator<char>_> *)((long)local_40 + 0x20))->
            super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x3) goto LAB_009da6b1;
        uVar12 = *(uint *)&((string *)local_40)->field_2 & 0x3f;
      }
      else {
        if (uVar5 != 2) goto LAB_009da67a;
        if ((((vector<char,_std::allocator<char>_> *)((long)local_40 + 0x20))->
            super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x2) goto LAB_009da692;
        uVar12 = *(uint *)&((string *)local_40)->field_2 & 0x1f;
      }
      if (*(char *)local_90 != '\x0e') goto LAB_009da65b;
      if ((__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)
          *(tuple<wasm::Memory_*,_std::default_delete<wasm::Memory>_> *)((long)local_90 + 8) ==
          (__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)0x3) {
        if ((((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> *)
             &(((pointer)((long)local_90 + 0x20))->_M_dataplus)._M_p)->_M_t).
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl != (Function *)0x3)
        goto LAB_009da6b1;
        uVar10 = *(uint *)((long)local_90 + 0x10) & 0x3f;
      }
      else {
        if ((_Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>)
            *(tuple<wasm::Memory_*,_std::default_delete<wasm::Memory>_> *)((long)local_90 + 8) !=
            (_Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>)0x2)
        goto LAB_009da67a;
        if ((((__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> *)
             &(((pointer)((long)local_90 + 0x20))->_M_dataplus)._M_p)->_M_t).
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl != (Function *)0x2)
        goto LAB_009da692;
        uVar10 = *(uint *)((long)local_90 + 0x10) & 0x1f;
      }
      if (uVar12 == uVar10) {
        TVar3.id = ((Type *)&((string *)local_40)->_M_string_length)->id;
        if (TVar3.id == 2) {
          IVar9 = Bits::getEffectiveShifts((Expression *)local_40);
          Literal::makeFromInt32
                    ((Literal *)&local_2f0.func,0xffffffff >> ((byte)IVar9 & 0x1f),(Type)0x2);
          Literal::operator=((Literal *)&((string *)local_40)->field_2,(Literal *)&local_2f0.func);
        }
        else {
          IVar9 = Bits::getEffectiveShifts((Expression *)local_40);
          Literal::makeFromInt64
                    ((Literal *)&local_2f0.func,0xffffffffffffffff >> ((byte)IVar9 & 0x3f),(Type)0x3
                    );
          Literal::operator=((Literal *)&((string *)local_40)->field_2,(Literal *)&local_2f0.func);
        }
        Literal::~Literal((Literal *)&local_2f0.func);
        BVar13 = Abstract::getBinary(TVar3,And);
LAB_009da642:
        *(BinaryOp *)&((local_110._M_head_impl)->super_Importable).super_Named.hasExplicitName =
             BVar13;
        return (Expression *)local_110._M_head_impl;
      }
    }
    local_40 = (undefined1  [8])0x0;
    local_2e0[0].binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_2e0[0].submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
    local_138._8_4_ = RotR;
    local_138._16_8_ = local_40;
    local_168 = (pointer)0x0;
    local_158 = (pointer)0x0;
    local_80 = (undefined1  [8])0x0;
    c1._0_4_ = 0xd;
    local_70 = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                *)local_138;
    local_2f0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_a8;
    local_178.i64 = (int64_t)(Module *)&inner_4;
    local_138._0_8_ = &local_190;
    local_138._24_8_ = &local_2f0;
    local_68._M_p = (pointer)&local_178;
    if ((((curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id !=
          BinaryId) ||
        (BVar13 = curr->op, BVar11 = Abstract::getBinary((Type)(curr->left->type).id,RotL),
        BVar13 != BVar11)) ||
       (bVar8 = Match::Internal::
                Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                ::match(curr,(SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                              *)&stack0xffffffffffffff90), !bVar8)) {
      local_90 = (undefined1  [8])0x0;
      local_70 = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                  *)0x0;
      local_60 = (pointer)0x0;
      inner._0_4_ = 0xd;
      local_100 = (pointer)local_90;
      local_f8 = (pointer)local_80;
      local_d8._0_8_ =
           (Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
            *)0x0;
      local_d8._16_8_ = (pointer)0x0;
      auVar7._4_4_ = uStack_30c;
      auVar7._0_4_ = 0xe;
      auVar7._8_8_ = &local_110;
      auVar7._16_8_ = local_e8;
      auVar7._24_8_ = local_2f8;
      auVar7._32_8_ = 0;
      local_110._M_head_impl = (Global *)&local_190;
      local_e8 = (undefined1  [8])&inner_4;
      local_80 = (undefined1  [8])&local_a8;
      bVar8 = Match::
              matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
                        ((Expression *)curr,
                         (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                          )(auVar7 << 0x40));
      if (!bVar8) {
        return (Expression *)(Module *)0x0;
      }
    }
    if (*(char *)&(((tuple<wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_> *)
                   &(local_a8->name)._M_dataplus._M_p)->
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  ).super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl != '\x0e')
    goto LAB_009da65b;
    sVar6 = (local_a8->name)._M_string_length;
    if (sVar6 == 3) {
      if ((local_a8->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x3) goto LAB_009da6b1;
      uVar12 = *(uint *)&(local_a8->name).field_2;
    }
    else {
      if (sVar6 != 2) goto LAB_009da67a;
      if ((local_a8->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x2) goto LAB_009da692;
      uVar12 = *(uint *)&(local_a8->name).field_2 & 0x1f;
    }
    if ((inner_4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
        ConstId) {
      TVar3.id = (inner_4->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type
                 .id;
      if (TVar3.id == 3) {
        if (inner_4->right != (Expression *)0x3) {
LAB_009da6b1:
          __assert_fail("type == Type::i64",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                        ,0x129,"int64_t wasm::Literal::geti64() const");
        }
        BVar13 = inner_4->op;
        uVar10 = 0x3f;
      }
      else {
        if (TVar3.id != 2) {
LAB_009da67a:
          handle_unreachable("unexpected type",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                             ,0x4a);
        }
        if (inner_4->right != (Expression *)0x2) {
LAB_009da692:
          __assert_fail("type == Type::i32",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                        ,0x120,"int32_t wasm::Literal::geti32() const");
        }
        BVar13 = inner_4->op & RemUInt64;
        uVar10 = 0x1f;
      }
      Literal::makeFromInt32((Literal *)&local_2f0.func,uVar12 - BVar13 & uVar10,TVar3);
      Literal::operator=((Literal *)&(local_a8->name).field_2,(Literal *)&local_2f0.func);
      Literal::~Literal((Literal *)&local_2f0.func);
      return (Expression *)local_190;
    }
  }
LAB_009da65b:
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,"T *wasm::Expression::cast() [T = wasm::Const]");
}

Assistant:

Expression* optimizeDoubletonWithConstantOnRight(Binary* curr) {
    using namespace Match;
    using namespace Abstract;
    {
      Binary* inner;
      Const *c1, *c2 = curr->right->cast<Const>();
      if (matches(curr->left, binary(&inner, any(), ival(&c1))) &&
          inner->op == curr->op) {
        Type type = inner->type;
        BinaryOp op = inner->op;
        // (x & C1) & C2   =>   x & (C1 & C2)
        if (op == getBinary(type, And)) {
          c1->value = c1->value.and_(c2->value);
          return inner;
        }
        // (x | C1) | C2   =>   x | (C1 | C2)
        if (op == getBinary(type, Or)) {
          c1->value = c1->value.or_(c2->value);
          return inner;
        }
        // (x ^ C1) ^ C2   =>   x ^ (C1 ^ C2)
        if (op == getBinary(type, Xor)) {
          c1->value = c1->value.xor_(c2->value);
          return inner;
        }
        // (x * C1) * C2   =>   x * (C1 * C2)
        if (op == getBinary(type, Mul)) {
          c1->value = c1->value.mul(c2->value);
          return inner;
        }
        // TODO:
        // handle signed / unsigned divisions. They are more complex

        // (x <<>> C1) <<>> C2   =>   x <<>> (C1 + C2)
        if (hasAnyShift(op)) {
          // shifts only use an effective amount from the constant, so
          // adding must be done carefully
          auto total =
            Bits::getEffectiveShifts(c1) + Bits::getEffectiveShifts(c2);
          auto effectiveTotal = Bits::getEffectiveShifts(total, c1->type);
          if (total == effectiveTotal) {
            // no overflow, we can do this
            c1->value = Literal::makeFromInt32(total, c1->type);
            return inner;
          } else {
            // overflow. Handle different scenarious
            if (hasAnyRotateShift(op)) {
              // overflow always accepted in rotation shifts
              c1->value = Literal::makeFromInt32(effectiveTotal, c1->type);
              return inner;
            }
            // handle overflows for general shifts
            //   x << C1 << C2    =>   0 or { drop(x), 0 }
            //   x >>> C1 >>> C2  =>   0 or { drop(x), 0 }
            // iff `C1 + C2` -> overflows
            if ((op == getBinary(type, Shl) || op == getBinary(type, ShrU))) {
              auto* x = inner->left;
              c1->value = Literal::makeZero(c1->type);
              if (!effects(x).hasSideEffects()) {
                //  =>  0
                return c1;
              } else {
                //  =>  { drop(x), 0 }
                Builder builder(*getModule());
                return builder.makeBlock({builder.makeDrop(x), c1});
              }
            }
            //   i32(x) >> C1 >> C2   =>   x >> 31
            //   i64(x) >> C1 >> C2   =>   x >> 63
            // iff `C1 + C2` -> overflows
            if (op == getBinary(type, ShrS)) {
              c1->value = Literal::makeFromInt32(c1->type.getByteSize() * 8 - 1,
                                                 c1->type);
              return inner;
            }
          }
        }
      }
    }
    {
      // (x << C1) * C2   =>   x * (C2 << C1)
      Binary* inner;
      Const *c1, *c2;
      if (matches(
            curr,
            binary(Mul, binary(&inner, Shl, any(), ival(&c1)), ival(&c2)))) {
        inner->op = getBinary(inner->type, Mul);
        c1->value = c2->value.shl(c1->value);
        return inner;
      }
    }
    {
      // (x * C1) << C2   =>   x * (C1 << C2)
      Binary* inner;
      Const *c1, *c2;
      if (matches(
            curr,
            binary(Shl, binary(&inner, Mul, any(), ival(&c1)), ival(&c2)))) {
        c1->value = c1->value.shl(c2->value);
        return inner;
      }
    }
    {
      // TODO: Add cancelation for some large constants when shrinkLevel > 0
      // in FinalOptimizer.

      // (x >> C)  << C   =>   x & -(1 << C)
      // (x >>> C) << C   =>   x & -(1 << C)
      Binary* inner;
      Const *c1, *c2;
      if (matches(curr,
                  binary(Shl, binary(&inner, any(), ival(&c1)), ival(&c2))) &&
          (inner->op == getBinary(inner->type, ShrS) ||
           inner->op == getBinary(inner->type, ShrU)) &&
          Bits::getEffectiveShifts(c1) == Bits::getEffectiveShifts(c2)) {
        auto type = c1->type;
        if (type == Type::i32) {
          c1->value = Literal::makeFromInt32(
            -(1U << Bits::getEffectiveShifts(c1)), Type::i32);
        } else {
          c1->value = Literal::makeFromInt64(
            -(1ULL << Bits::getEffectiveShifts(c1)), Type::i64);
        }
        inner->op = getBinary(type, And);
        return inner;
      }
    }
    {
      // TODO: Add cancelation for some large constants when shrinkLevel > 0
      // in FinalOptimizer.

      // (x << C) >>> C   =>   x & (-1 >>> C)
      // (x << C) >> C    =>   skip
      Binary* inner;
      Const *c1, *c2;
      if (matches(
            curr,
            binary(ShrU, binary(&inner, Shl, any(), ival(&c1)), ival(&c2))) &&
          Bits::getEffectiveShifts(c1) == Bits::getEffectiveShifts(c2)) {
        auto type = c1->type;
        if (type == Type::i32) {
          c1->value = Literal::makeFromInt32(
            -1U >> Bits::getEffectiveShifts(c1), Type::i32);
        } else {
          c1->value = Literal::makeFromInt64(
            -1ULL >> Bits::getEffectiveShifts(c1), Type::i64);
        }
        inner->op = getBinary(type, And);
        return inner;
      }
    }
    {
      // TODO: Add canonicalization rotr to rotl and remove these rules.
      // rotl(rotr(x, C1), C2)   =>   rotr(x, C1 - C2)
      // rotr(rotl(x, C1), C2)   =>   rotl(x, C1 - C2)
      Binary* inner;
      Const *c1, *c2;
      if (matches(
            curr,
            binary(RotL, binary(&inner, RotR, any(), ival(&c1)), ival(&c2))) ||
          matches(
            curr,
            binary(RotR, binary(&inner, RotL, any(), ival(&c1)), ival(&c2)))) {
        auto diff = Bits::getEffectiveShifts(c1) - Bits::getEffectiveShifts(c2);
        c1->value = Literal::makeFromInt32(
          Bits::getEffectiveShifts(diff, c2->type), c2->type);
        return inner;
      }
    }
    return nullptr;
  }